

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupIntern(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
            uint nMaxSolutions,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  vector<CNetAddr,_std::allocator<CNetAddr>_> *pvVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  CNetAddr *resolved;
  long in_FS_OFFSET;
  initializer_list<CNetAddr> __l;
  allocator_type local_79;
  direct_or_indirect local_78;
  uint local_68;
  undefined8 local_60;
  direct_or_indirect local_58;
  uint local_48;
  undefined8 local_40;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *local_38;
  
  local_38 = *(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28);
  if (name->_M_string_length != 0) {
    sVar4 = 0;
    do {
      if ((name->_M_dataplus)._M_p[sVar4] == '\0') {
        pvVar1 = *(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28);
        if (pvVar1 == local_38) {
          (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          return pvVar1;
        }
        goto LAB_006c3c2a;
      }
      sVar4 = sVar4 + 1;
    } while (name->_M_string_length != sVar4);
  }
  CNetAddr::CNetAddr((CNetAddr *)&local_58.indirect_contents);
  bVar2 = CNetAddr::SetSpecial((CNetAddr *)&local_58.indirect_contents,name);
  if (bVar2) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
    local_60 = local_40;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_78;
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector(__return_storage_ptr__,__l,&local_79);
    if (0x10 < local_68) {
      free((void *)CONCAT71(local_78._1_7_,local_78.direct[0]));
    }
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
  }
  if (!bVar2) {
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.direct[0] = fAllowLookup;
    if ((dns_lookup_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      if (*(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28) == local_38) {
        uVar3 = std::__throw_bad_function_call();
        if (0x10 < local_68) {
          free((void *)CONCAT71(local_78._1_7_,local_78.direct[0]));
        }
        if (0x10 < local_48) {
          free(local_58.indirect_contents.indirect);
        }
        if (*(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar3);
        }
      }
      goto LAB_006c3c2a;
    }
    (*dns_lookup_function->_M_invoker)
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&local_58.indirect_contents,
               (_Any_data *)dns_lookup_function,name,(bool *)local_78.direct);
    if (local_58.indirect_contents.indirect != (char *)local_58._8_8_) {
      uVar3 = local_58.indirect_contents.indirect;
      do {
        if ((nMaxSolutions != 0) &&
           ((ulong)nMaxSolutions <=
            (ulong)((long)(__return_storage_ptr__->
                          super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->
                          super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 5))) break;
        bVar2 = CNetAddr::IsInternal((CNetAddr *)uVar3);
        if (!bVar2) {
          std::vector<CNetAddr,_std::allocator<CNetAddr>_>::push_back
                    (__return_storage_ptr__,(value_type *)uVar3);
        }
        uVar3 = uVar3 + 0x20;
      } while (uVar3 != local_58._8_8_);
    }
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&local_58.indirect_contents);
  }
  if (*(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<CNetAddr,_std::allocator<CNetAddr>_> **)(in_FS_OFFSET + 0x28);
  }
LAB_006c3c2a:
  __stack_chk_fail();
}

Assistant:

static std::vector<CNetAddr> LookupIntern(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    {
        CNetAddr addr;
        // From our perspective, onion addresses are not hostnames but rather
        // direct encodings of CNetAddr much like IPv4 dotted-decimal notation
        // or IPv6 colon-separated hextet notation. Since we can't use
        // getaddrinfo to decode them and it wouldn't make sense to resolve
        // them, we return a network address representing it instead. See
        // CNetAddr::SetSpecial(const std::string&) for more details.
        if (addr.SetSpecial(name)) return {addr};
    }

    std::vector<CNetAddr> addresses;

    for (const CNetAddr& resolved : dns_lookup_function(name, fAllowLookup)) {
        if (nMaxSolutions > 0 && addresses.size() >= nMaxSolutions) {
            break;
        }
        /* Never allow resolving to an internal address. Consider any such result invalid */
        if (!resolved.IsInternal()) {
            addresses.push_back(resolved);
        }
    }

    return addresses;
}